

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_join_ti_impl.h
# Opt level: O0

void __thiscall
join::
TJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
::TJoinTI(TJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
          *this)

{
  LabelDictionary<label::StringLabel> local_68;
  TJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
  *local_10;
  TJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
  *this_local;
  
  local_10 = this;
  label::LabelDictionary<label::StringLabel>::LabelDictionary(&this->ld_);
  label::LabelDictionary<label::StringLabel>::LabelDictionary(&local_68);
  label::LabelDictionary<label::StringLabel>::operator=(&this->ld_,&local_68);
  label::LabelDictionary<label::StringLabel>::~LabelDictionary(&local_68);
  this->pre_candidates_ = 0;
  this->sum_subproblem_counter_ = 0;
  this->number_of_labels_ = 0;
  this->il_lookups_ = 0;
  return;
}

Assistant:

TJoinTI<Label, VerificationAlgorithm>::TJoinTI() {
  ld_ = label::LabelDictionary<Label>();
  pre_candidates_ = 0;
  sum_subproblem_counter_ = 0;
  number_of_labels_ = 0;
  il_lookups_ = 0;
}